

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.cpp
# Opt level: O0

string * get_seq_from_reference
                   (string *__return_storage_ptr__,string *reference,
                   vector<chromosome_inf,_std::allocator<chromosome_inf>_> *chr_inf,
                   string *chromosome,uint64_t start,uint64_t end)

{
  uint64_t uVar1;
  byte bVar2;
  int iVar3;
  size_type sVar4;
  char *pcVar5;
  char *__s2;
  const_reference pvVar6;
  ostream *this;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  undefined8 local_2a8;
  char local_299;
  char *local_298;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_290;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  undefined8 local_280;
  allocator<char> local_272;
  undefined1 local_271;
  char *local_270;
  char *buffer;
  char local_258 [8];
  ifstream ref_handle;
  ulong local_50;
  size_t i;
  uint64_t offset_end;
  uint64_t offset_start;
  uint64_t end_local;
  uint64_t start_local;
  string *chromosome_local;
  vector<chromosome_inf,_std::allocator<chromosome_inf>_> *chr_inf_local;
  string *reference_local;
  string *buff_string;
  
  offset_end = 0;
  i = 0;
  for (local_50 = 0;
      sVar4 = std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::size(chr_inf),
      local_50 < sVar4; local_50 = local_50 + 1) {
    std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::operator[](chr_inf,local_50);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    __s2 = (char *)std::__cxx11::string::c_str();
    iVar3 = strcmp(pcVar5,__s2);
    if (iVar3 == 0) {
      pvVar6 = std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::operator[]
                         (chr_inf,local_50);
      uVar1 = pvVar6->start_offset;
      pvVar6 = std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::operator[]
                         (chr_inf,local_50);
      offset_end = uVar1 + start + start / pvVar6->line_bases;
      pvVar6 = std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::operator[]
                         (chr_inf,local_50);
      uVar1 = pvVar6->start_offset;
      pvVar6 = std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::operator[]
                         (chr_inf,local_50);
      i = uVar1 + end + end / pvVar6->line_bases;
    }
  }
  std::ifstream::ifstream(local_258,(string *)reference,_S_in);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) != 0) {
    local_270 = (char *)calloc((i - offset_end) + 1,1);
    std::istream::seekg((long)local_258,(_Ios_Seekdir)offset_end);
    std::istream::read(local_258,(long)local_270);
    pcVar5 = local_270;
    local_271 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar5,&local_272);
    std::allocator<char>::~allocator(&local_272);
    local_290._M_current = (char *)std::__cxx11::string::begin();
    local_298 = (char *)std::__cxx11::string::end();
    local_299 = '\n';
    local_288 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                          (local_290,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_298,&local_299);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_280,&local_288);
    local_2b0._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_2a8,&local_2b0);
    std::__cxx11::string::erase(__return_storage_ptr__,local_280,local_2a8);
    std::ifstream::close();
    local_271 = 1;
    std::ifstream::~ifstream(local_258);
    return __return_storage_ptr__;
  }
  this = std::operator<<((ostream *)&std::cerr,"cant open refernce file");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

string get_seq_from_reference(string reference ,const vector<chromosome_inf> * chr_inf, string chromosome, uint64_t start , uint64_t end){
    uint64_t offset_start = 0;
    uint64_t offset_end = 0;
    for (size_t i = 0 ; i < (*chr_inf).size() ;i++){
        // uint64_t start_offset;
        // uint32_t line_bases;
        // uint32_t line_width;
        if ( strcmp ( (*chr_inf)[i].chromosome.c_str(), chromosome.c_str()) == 0){
            offset_start = (*chr_inf)[i].start_offset + start + start/(*chr_inf)[i].line_bases;
            offset_end = (*chr_inf)[i].start_offset + end + end/(*chr_inf)[i].line_bases;
        }
    }
    
    ifstream ref_handle (reference );
    if (ref_handle.is_open()){
        char * buffer =  (char *)calloc(offset_end-offset_start+1,sizeof(char));
        ref_handle.seekg(offset_start,ios::beg);  
        ref_handle.read(buffer,offset_end-offset_start);

        // std:remove(buffer, buffer+strlen(buffer), '\n') == '\0';
        string buff_string(buffer);
        buff_string.erase(std::remove(buff_string.begin(), buff_string.end(), '\n'), buff_string.end());
        ref_handle.close();
        return buff_string;
    }else{
        cerr << "cant open refernce file"<< endl;
        exit(-1);
    }
}